

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

char * dpfb::args::varNameToArgName(char *name)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  
  if (varNameToArgName(char_const*)::nameStr_abi_cxx11_ == '\0') {
    varNameToArgName();
  }
  varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_string_length = 0;
  *varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_dataplus._M_p = '\0';
  std::__cxx11::string::push_back('0');
  cVar3 = *name;
  if (cVar3 != '\0') {
    pcVar2 = name + 1;
    do {
      iVar1 = isupper((int)cVar3);
      if (iVar1 != 0) {
        std::__cxx11::string::push_back('0');
        tolower((int)cVar3);
      }
      std::__cxx11::string::push_back('0');
      cVar3 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar3 != '\0');
  }
  return varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

static const char* varNameToArgName(const char* name)
{
    static std::string nameStr;
    nameStr.clear();

    nameStr += '-';

    while (*name) {
        const auto c = *name;
        ++name;

        if (std::isupper(c)) {
            nameStr += '-';
            nameStr += std::tolower(c);
        } else
            nameStr += c;
    }

    return nameStr.c_str();
}